

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,v10 *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_98;
  undefined1 local_89;
  char *local_88;
  size_t local_80;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  bool formattable;
  bool formattable_pointer;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pfStack_70;
  bool formattable_char;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68 [5];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  undefined1 *local_38;
  basic_string_view<char> local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_20;
  basic_string_view<char> local_18;
  
  local_98 = &args_local;
  local_71 = 1;
  local_72 = 1;
  local_73 = 1;
  local_38 = &local_89;
  local_a0 = __return_storage_ptr__;
  pfStack_70 = __return_storage_ptr__;
  local_40 = __return_storage_ptr__;
  local_30 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __return_storage_ptr__);
  local_88 = local_30.data_;
  local_80 = local_30.size_;
  local_18.data_ = local_30.data_;
  local_18.size_ = local_30.size_;
  local_20 = local_68;
  local_68[0] = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)basic_string_view<char>::data(&local_18);
  basic_string_view<char>::size(&local_18);
  return local_68[0];
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}